

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Array<unsigned_char> * __thiscall
kj::anon_unknown_59::InMemoryFile::mmapPrivate
          (Array<unsigned_char> *__return_storage_ptr__,InMemoryFile *this,uint64_t offset,
          uint64_t size)

{
  uchar *__buf;
  ulong uVar1;
  
  __buf = (uchar *)kj::_::HeapArrayDisposer::allocateImpl
                             (1,size,size,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  __return_storage_ptr__->ptr = __buf;
  __return_storage_ptr__->size_ = size;
  __return_storage_ptr__->disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  uVar1 = read(this,(int)offset,__buf,size);
  if (uVar1 <= size && size - uVar1 != 0) {
    memset(__buf + uVar1,0,size - uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

Array<byte> mmapPrivate(uint64_t offset, uint64_t size) const override {
    // Return a copy.

    // Allocate exactly the size requested.
    auto result = heapArray<byte>(size);

    // Use read() to fill it.
    size_t actual = read(offset, result);

    // Ignore the rest.
    if (actual < size) {
      memset(result.begin() + actual, 0, size - actual);
    }

    return result;
  }